

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhi.cpp
# Opt level: O3

QDebug operator<<(QDebug dbg,QRhiScissor *s)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 *in_RDX;
  QTextStream *pQVar3;
  long in_FS_OFFSET;
  QByteArrayView QVar4;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QDebugStateSaver saver;
  undefined1 *local_58;
  QArrayData *local_50 [3];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_58,(QDebug *)s);
  uVar1 = *in_RDX;
  uVar2 = in_RDX[1];
  pQVar3 = *(QTextStream **)(s->m_rect)._M_elems;
  pQVar3[0x30] = (QTextStream)0x0;
  QVar4.m_data = (storage_type *)0x1a;
  QVar4.m_size = (qsizetype)local_50;
  QString::fromUtf8(QVar4);
  QTextStream::operator<<(pQVar3,(QString *)local_50);
  if (local_50[0] != (QArrayData *)0x0) {
    LOCK();
    (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_50[0],2,0x10);
    }
  }
  pQVar3 = *(QTextStream **)(s->m_rect)._M_elems;
  if (pQVar3[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar3,' ');
    pQVar3 = *(QTextStream **)(s->m_rect)._M_elems;
  }
  QTextStream::operator<<(pQVar3,(int)uVar1);
  pQVar3 = *(QTextStream **)(s->m_rect)._M_elems;
  if (pQVar3[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar3,' ');
    pQVar3 = *(QTextStream **)(s->m_rect)._M_elems;
  }
  QVar5.m_data = (storage_type *)0xf;
  QVar5.m_size = (qsizetype)local_50;
  QString::fromUtf8(QVar5);
  QTextStream::operator<<(pQVar3,(QString *)local_50);
  if (local_50[0] != (QArrayData *)0x0) {
    LOCK();
    (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_50[0],2,0x10);
    }
  }
  pQVar3 = *(QTextStream **)(s->m_rect)._M_elems;
  if (pQVar3[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar3,' ');
    pQVar3 = *(QTextStream **)(s->m_rect)._M_elems;
  }
  QTextStream::operator<<(pQVar3,(int)((ulong)uVar1 >> 0x20));
  pQVar3 = *(QTextStream **)(s->m_rect)._M_elems;
  if (pQVar3[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar3,' ');
    pQVar3 = *(QTextStream **)(s->m_rect)._M_elems;
  }
  QVar6.m_data = (storage_type *)0x7;
  QVar6.m_size = (qsizetype)local_50;
  QString::fromUtf8(QVar6);
  QTextStream::operator<<(pQVar3,(QString *)local_50);
  if (local_50[0] != (QArrayData *)0x0) {
    LOCK();
    (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_50[0],2,0x10);
    }
  }
  pQVar3 = *(QTextStream **)(s->m_rect)._M_elems;
  if (pQVar3[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar3,' ');
    pQVar3 = *(QTextStream **)(s->m_rect)._M_elems;
  }
  QTextStream::operator<<(pQVar3,(int)uVar2);
  pQVar3 = *(QTextStream **)(s->m_rect)._M_elems;
  if (pQVar3[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar3,' ');
    pQVar3 = *(QTextStream **)(s->m_rect)._M_elems;
  }
  QVar7.m_data = &DAT_00000008;
  QVar7.m_size = (qsizetype)local_50;
  QString::fromUtf8(QVar7);
  QTextStream::operator<<(pQVar3,(QString *)local_50);
  if (local_50[0] != (QArrayData *)0x0) {
    LOCK();
    (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_50[0],2,0x10);
    }
  }
  pQVar3 = *(QTextStream **)(s->m_rect)._M_elems;
  if (pQVar3[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar3,' ');
    pQVar3 = *(QTextStream **)(s->m_rect)._M_elems;
  }
  QTextStream::operator<<(pQVar3,(int)((ulong)uVar2 >> 0x20));
  pQVar3 = *(QTextStream **)(s->m_rect)._M_elems;
  if (pQVar3[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar3,' ');
    pQVar3 = *(QTextStream **)(s->m_rect)._M_elems;
  }
  QTextStream::operator<<(pQVar3,')');
  pQVar3 = *(QTextStream **)(s->m_rect)._M_elems;
  if (pQVar3[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar3,' ');
    pQVar3 = *(QTextStream **)(s->m_rect)._M_elems;
  }
  (s->m_rect)._M_elems[0] = 0;
  (s->m_rect)._M_elems[1] = 0;
  *(QTextStream **)dbg.stream = pQVar3;
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QDebug)dbg.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const QRhiScissor &s)
{
    QDebugStateSaver saver(dbg);
    const std::array<int, 4> r = s.scissor();
    dbg.nospace() << "QRhiScissor(bottom-left-x=" << r[0]
                  << " bottom-left-y=" << r[1]
                  << " width=" << r[2]
                  << " height=" << r[3]
                  << ')';
    return dbg;
}